

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeLDR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t Val_00;
  uint32_t uVar4;
  DecodeStatus DVar5;
  uint Rm;
  uint Rt;
  uint Rn;
  uint Cond;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Rn = 3;
  _Cond = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0x10,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  Val_00 = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  if ((uVar4 != 0) || (RegNo == RegNo_00)) {
    Rn = 1;
  }
  DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Cond);
  _Var1 = Check(&Rn,DVar5);
  if (_Var1) {
    DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Cond);
    _Var1 = Check(&Rn,DVar5);
    if (_Var1) {
      DVar5 = DecodeAddrMode7Operand(pMStack_18,RegNo,(uint64_t)Decoder_local,_Cond);
      _Var1 = Check(&Rn,DVar5);
      if (_Var1) {
        DVar5 = DecodePostIdxReg(pMStack_18,uVar3 << 4 | uVar2,(uint64_t)Decoder_local,_Cond);
        _Var1 = Check(&Rn,DVar5);
        if (_Var1) {
          DVar5 = DecodePredicateOperand(pMStack_18,Val_00,(uint64_t)Decoder_local,_Cond);
          _Var1 = Check(&Rn,DVar5);
          if (_Var1) {
            Inst_local._4_4_ = Rn;
          }
          else {
            Inst_local._4_4_ = MCDisassembler_Fail;
          }
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeLDR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Cond;
	unsigned Rn = fieldFromInstruction_4(Val, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	Rm |= (fieldFromInstruction_4(Val, 23, 1) << 4);
	Cond = fieldFromInstruction_4(Val, 28, 4);

	if (fieldFromInstruction_4(Val, 8, 4) != 0 || Rn == Rt)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrMode7Operand(Inst, Rn, Address, Decoder))) 
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePostIdxReg(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, Cond, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}